

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O3

void do_barray_io(j_common_ptr cinfo,jvirt_barray_ptr ptr,boolean writing)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  uVar3 = (ulong)ptr->rows_in_mem;
  if (uVar3 != 0) {
    lVar4 = (ulong)ptr->blocksperrow * 0x80;
    uVar6 = (ulong)ptr->rowsperchunk;
    lVar7 = (ulong)ptr->cur_start_row * lVar4;
    uVar5 = 0;
    do {
      uVar1 = uVar3 - uVar5;
      if ((long)uVar6 <= (long)(uVar3 - uVar5)) {
        uVar1 = uVar6;
      }
      lVar2 = ptr->cur_start_row + uVar5;
      uVar3 = (ulong)ptr->first_undef_row - lVar2;
      if ((long)uVar1 < (long)uVar3) {
        uVar3 = uVar1;
      }
      uVar6 = (ulong)ptr->rows_in_array - lVar2;
      if ((long)uVar3 < (long)uVar6) {
        uVar6 = uVar3;
      }
      if ((long)uVar6 < 1) {
        return;
      }
      lVar2 = uVar6 * lVar4;
      (*(&(ptr->b_s_info).read_backing_store)[writing != 0])
                (cinfo,&ptr->b_s_info,ptr->mem_buffer[uVar5],lVar7,lVar2);
      lVar7 = lVar7 + lVar2;
      uVar3 = (ulong)ptr->rows_in_mem;
      uVar6 = (ulong)ptr->rowsperchunk;
      uVar5 = uVar5 + uVar6;
    } while (uVar5 < uVar3);
  }
  return;
}

Assistant:

LOCAL(void)
do_barray_io (j_common_ptr cinfo, jvirt_barray_ptr ptr, boolean writing)
/* Do backing store read or write of a virtual coefficient-block array */
{
  long bytesperrow, file_offset, byte_count, rows, thisrow, i;

  bytesperrow = (long) ptr->blocksperrow * SIZEOF(JBLOCK);
  file_offset = ptr->cur_start_row * bytesperrow;
  /* Loop to read or write each allocation chunk in mem_buffer */
  for (i = 0; i < (long) ptr->rows_in_mem; i += ptr->rowsperchunk) {
    /* One chunk, but check for short chunk at end of buffer */
    rows = MIN((long) ptr->rowsperchunk, (long) ptr->rows_in_mem - i);
    /* Transfer no more than is currently defined */
    thisrow = (long) ptr->cur_start_row + i;
    rows = MIN(rows, (long) ptr->first_undef_row - thisrow);
    /* Transfer no more than fits in file */
    rows = MIN(rows, (long) ptr->rows_in_array - thisrow);
    if (rows <= 0)		/* this chunk might be past end of file! */
      break;
    byte_count = rows * bytesperrow;
    if (writing)
      (*ptr->b_s_info.write_backing_store) (cinfo, & ptr->b_s_info,
					    (void FAR *) ptr->mem_buffer[i],
					    file_offset, byte_count);
    else
      (*ptr->b_s_info.read_backing_store) (cinfo, & ptr->b_s_info,
					   (void FAR *) ptr->mem_buffer[i],
					   file_offset, byte_count);
    file_offset += byte_count;
  }
}